

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O1

int __thiscall bwtil::ContextAutomata::init(ContextAutomata *this,EVP_PKEY_CTX *ctx)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int extraout_EAX;
  value_type_conflict2 *__val_1;
  ulint uVar8;
  ostream *poVar9;
  pointer __s;
  pointer puVar10;
  long lVar11;
  int in_EDX;
  byte bVar12;
  value_type_conflict3 *__val;
  ulong uVar13;
  reference rVar14;
  symbol s;
  vector<bool,_std::allocator<bool>_> inserted;
  bool local_7a;
  allocator_type local_79;
  uchar *local_78;
  iterator iStack_70;
  uchar *local_68;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if (in_EDX != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n*** Building context automata ***\n\n",0x24);
  }
  this->bwIt = (BackwardIterator *)ctx;
  uVar8 = (**(code **)(*(long *)ctx + 0x30))(ctx);
  this->n = uVar8;
  this->null_ptr = 0xffffffff;
  bVar12 = (byte)in_EDX;
  if (bVar12 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," Text length is ",0x10);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  __s = (pointer)operator_new(0x400);
  memset(__s,0,0x400);
  puVar1 = (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x100;
  (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x100;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar10 = (pointer)operator_new(0x100);
  puVar10[0] = '\0';
  puVar10[1] = '\0';
  puVar10[2] = '\0';
  puVar10[3] = '\0';
  puVar10[4] = '\0';
  puVar10[5] = '\0';
  puVar10[6] = '\0';
  puVar10[7] = '\0';
  puVar10[8] = '\0';
  puVar10[9] = '\0';
  puVar10[10] = '\0';
  puVar10[0xb] = '\0';
  puVar10[0xc] = '\0';
  puVar10[0xd] = '\0';
  puVar10[0xe] = '\0';
  puVar10[0xf] = '\0';
  puVar10[0x10] = '\0';
  puVar10[0x11] = '\0';
  puVar10[0x12] = '\0';
  puVar10[0x13] = '\0';
  puVar10[0x14] = '\0';
  puVar10[0x15] = '\0';
  puVar10[0x16] = '\0';
  puVar10[0x17] = '\0';
  puVar10[0x18] = '\0';
  puVar10[0x19] = '\0';
  puVar10[0x1a] = '\0';
  puVar10[0x1b] = '\0';
  puVar10[0x1c] = '\0';
  puVar10[0x1d] = '\0';
  puVar10[0x1e] = '\0';
  puVar10[0x1f] = '\0';
  puVar10[0x20] = '\0';
  puVar10[0x21] = '\0';
  puVar10[0x22] = '\0';
  puVar10[0x23] = '\0';
  puVar10[0x24] = '\0';
  puVar10[0x25] = '\0';
  puVar10[0x26] = '\0';
  puVar10[0x27] = '\0';
  puVar10[0x28] = '\0';
  puVar10[0x29] = '\0';
  puVar10[0x2a] = '\0';
  puVar10[0x2b] = '\0';
  puVar10[0x2c] = '\0';
  puVar10[0x2d] = '\0';
  puVar10[0x2e] = '\0';
  puVar10[0x2f] = '\0';
  puVar10[0x30] = '\0';
  puVar10[0x31] = '\0';
  puVar10[0x32] = '\0';
  puVar10[0x33] = '\0';
  puVar10[0x34] = '\0';
  puVar10[0x35] = '\0';
  puVar10[0x36] = '\0';
  puVar10[0x37] = '\0';
  puVar10[0x38] = '\0';
  puVar10[0x39] = '\0';
  puVar10[0x3a] = '\0';
  puVar10[0x3b] = '\0';
  puVar10[0x3c] = '\0';
  puVar10[0x3d] = '\0';
  puVar10[0x3e] = '\0';
  puVar10[0x3f] = '\0';
  puVar10[0x40] = '\0';
  puVar10[0x41] = '\0';
  puVar10[0x42] = '\0';
  puVar10[0x43] = '\0';
  puVar10[0x44] = '\0';
  puVar10[0x45] = '\0';
  puVar10[0x46] = '\0';
  puVar10[0x47] = '\0';
  puVar10[0x48] = '\0';
  puVar10[0x49] = '\0';
  puVar10[0x4a] = '\0';
  puVar10[0x4b] = '\0';
  puVar10[0x4c] = '\0';
  puVar10[0x4d] = '\0';
  puVar10[0x4e] = '\0';
  puVar10[0x4f] = '\0';
  puVar10[0x50] = '\0';
  puVar10[0x51] = '\0';
  puVar10[0x52] = '\0';
  puVar10[0x53] = '\0';
  puVar10[0x54] = '\0';
  puVar10[0x55] = '\0';
  puVar10[0x56] = '\0';
  puVar10[0x57] = '\0';
  puVar10[0x58] = '\0';
  puVar10[0x59] = '\0';
  puVar10[0x5a] = '\0';
  puVar10[0x5b] = '\0';
  puVar10[0x5c] = '\0';
  puVar10[0x5d] = '\0';
  puVar10[0x5e] = '\0';
  puVar10[0x5f] = '\0';
  puVar10[0x60] = '\0';
  puVar10[0x61] = '\0';
  puVar10[0x62] = '\0';
  puVar10[99] = '\0';
  puVar10[100] = '\0';
  puVar10[0x65] = '\0';
  puVar10[0x66] = '\0';
  puVar10[0x67] = '\0';
  puVar10[0x68] = '\0';
  puVar10[0x69] = '\0';
  puVar10[0x6a] = '\0';
  puVar10[0x6b] = '\0';
  puVar10[0x6c] = '\0';
  puVar10[0x6d] = '\0';
  puVar10[0x6e] = '\0';
  puVar10[0x6f] = '\0';
  puVar10[0x70] = '\0';
  puVar10[0x71] = '\0';
  puVar10[0x72] = '\0';
  puVar10[0x73] = '\0';
  puVar10[0x74] = '\0';
  puVar10[0x75] = '\0';
  puVar10[0x76] = '\0';
  puVar10[0x77] = '\0';
  puVar10[0x78] = '\0';
  puVar10[0x79] = '\0';
  puVar10[0x7a] = '\0';
  puVar10[0x7b] = '\0';
  puVar10[0x7c] = '\0';
  puVar10[0x7d] = '\0';
  puVar10[0x7e] = '\0';
  puVar10[0x7f] = '\0';
  puVar10[0x80] = '\0';
  puVar10[0x81] = '\0';
  puVar10[0x82] = '\0';
  puVar10[0x83] = '\0';
  puVar10[0x84] = '\0';
  puVar10[0x85] = '\0';
  puVar10[0x86] = '\0';
  puVar10[0x87] = '\0';
  puVar10[0x88] = '\0';
  puVar10[0x89] = '\0';
  puVar10[0x8a] = '\0';
  puVar10[0x8b] = '\0';
  puVar10[0x8c] = '\0';
  puVar10[0x8d] = '\0';
  puVar10[0x8e] = '\0';
  puVar10[0x8f] = '\0';
  puVar10[0x90] = '\0';
  puVar10[0x91] = '\0';
  puVar10[0x92] = '\0';
  puVar10[0x93] = '\0';
  puVar10[0x94] = '\0';
  puVar10[0x95] = '\0';
  puVar10[0x96] = '\0';
  puVar10[0x97] = '\0';
  puVar10[0x98] = '\0';
  puVar10[0x99] = '\0';
  puVar10[0x9a] = '\0';
  puVar10[0x9b] = '\0';
  puVar10[0x9c] = '\0';
  puVar10[0x9d] = '\0';
  puVar10[0x9e] = '\0';
  puVar10[0x9f] = '\0';
  puVar10[0xa0] = '\0';
  puVar10[0xa1] = '\0';
  puVar10[0xa2] = '\0';
  puVar10[0xa3] = '\0';
  puVar10[0xa4] = '\0';
  puVar10[0xa5] = '\0';
  puVar10[0xa6] = '\0';
  puVar10[0xa7] = '\0';
  puVar10[0xa8] = '\0';
  puVar10[0xa9] = '\0';
  puVar10[0xaa] = '\0';
  puVar10[0xab] = '\0';
  puVar10[0xac] = '\0';
  puVar10[0xad] = '\0';
  puVar10[0xae] = '\0';
  puVar10[0xaf] = '\0';
  puVar10[0xb0] = '\0';
  puVar10[0xb1] = '\0';
  puVar10[0xb2] = '\0';
  puVar10[0xb3] = '\0';
  puVar10[0xb4] = '\0';
  puVar10[0xb5] = '\0';
  puVar10[0xb6] = '\0';
  puVar10[0xb7] = '\0';
  puVar10[0xb8] = '\0';
  puVar10[0xb9] = '\0';
  puVar10[0xba] = '\0';
  puVar10[0xbb] = '\0';
  puVar10[0xbc] = '\0';
  puVar10[0xbd] = '\0';
  puVar10[0xbe] = '\0';
  puVar10[0xbf] = '\0';
  puVar10[0xc0] = '\0';
  puVar10[0xc1] = '\0';
  puVar10[0xc2] = '\0';
  puVar10[0xc3] = '\0';
  puVar10[0xc4] = '\0';
  puVar10[0xc5] = '\0';
  puVar10[0xc6] = '\0';
  puVar10[199] = '\0';
  puVar10[200] = '\0';
  puVar10[0xc9] = '\0';
  puVar10[0xca] = '\0';
  puVar10[0xcb] = '\0';
  puVar10[0xcc] = '\0';
  puVar10[0xcd] = '\0';
  puVar10[0xce] = '\0';
  puVar10[0xcf] = '\0';
  puVar10[0xd0] = '\0';
  puVar10[0xd1] = '\0';
  puVar10[0xd2] = '\0';
  puVar10[0xd3] = '\0';
  puVar10[0xd4] = '\0';
  puVar10[0xd5] = '\0';
  puVar10[0xd6] = '\0';
  puVar10[0xd7] = '\0';
  puVar10[0xd8] = '\0';
  puVar10[0xd9] = '\0';
  puVar10[0xda] = '\0';
  puVar10[0xdb] = '\0';
  puVar10[0xdc] = '\0';
  puVar10[0xdd] = '\0';
  puVar10[0xde] = '\0';
  puVar10[0xdf] = '\0';
  puVar10[0xe0] = '\0';
  puVar10[0xe1] = '\0';
  puVar10[0xe2] = '\0';
  puVar10[0xe3] = '\0';
  puVar10[0xe4] = '\0';
  puVar10[0xe5] = '\0';
  puVar10[0xe6] = '\0';
  puVar10[0xe7] = '\0';
  puVar10[0xe8] = '\0';
  puVar10[0xe9] = '\0';
  puVar10[0xea] = '\0';
  puVar10[0xeb] = '\0';
  puVar10[0xec] = '\0';
  puVar10[0xed] = '\0';
  puVar10[0xee] = '\0';
  puVar10[0xef] = '\0';
  puVar10[0xf0] = '\0';
  puVar10[0xf1] = '\0';
  puVar10[0xf2] = '\0';
  puVar10[0xf3] = '\0';
  puVar10[0xf4] = '\0';
  puVar10[0xf5] = '\0';
  puVar10[0xf6] = '\0';
  puVar10[0xf7] = '\0';
  puVar10[0xf8] = '\0';
  puVar10[0xf9] = '\0';
  puVar10[0xfa] = '\0';
  puVar10[0xfb] = '\0';
  puVar10[0xfc] = '\0';
  puVar10[0xfd] = '\0';
  puVar10[0xfe] = '\0';
  puVar10[0xff] = '\0';
  puVar2 = (this->inverse_remapping).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar10;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar10 + 0x100;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10 + 0x100;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  lVar11 = 0;
  do {
    (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar11] = 0x100;
    (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar11] = '\0';
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  if (bVar12 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n scanning file to detect alphabet ... ",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  local_78 = (uchar *)0x0;
  iStack_70._M_current = (uchar *)0x0;
  local_68 = (uchar *)0x0;
  local_7a = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_58,0x100,&local_7a,&local_79);
  iVar7 = -1;
  uVar13 = 0;
  while( true ) {
    iVar5 = (*this->bwIt->_vptr_BackwardIterator[4])();
    if ((char)iVar5 != '\0') {
      if (bVar12 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," done.\n\n Sorting alphabet ... ",0x1e);
        std::ostream::flush();
      }
      puVar4 = local_78;
      if (local_78 != iStack_70._M_current) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_78,iStack_70._M_current,
                   (int)LZCOUNT((long)iStack_70._M_current - (long)local_78) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar4);
      }
      if (bVar12 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"done. Alphabet size: sigma = ",0x1d);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      this->sigma = 1;
      if (iStack_70._M_current != local_78) {
        puVar1 = (this->remapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          if (puVar1[local_78[uVar13]] == 0x100) {
            puVar1[local_78[uVar13]] = this->sigma;
            this->sigma = this->sigma + 1;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar13 & 0xffffffff) < (ulong)((long)iStack_70._M_current - (long)local_78));
      }
      if (bVar12 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n Alphabet (ASCII codes) = { ",0x1d);
      }
      if (iStack_70._M_current != local_78) {
        uVar13 = 1;
        do {
          if (bVar12 != 0) {
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            local_7a = true;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_7a,1);
          }
          bVar3 = uVar13 < (ulong)((long)iStack_70._M_current - (long)local_78);
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (bVar3);
      }
      if (bVar12 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
      }
      this->TERMINATOR = '\0';
      lVar11 = 1;
      do {
        uVar13 = (ulong)(this->remapping).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11];
        if (uVar13 != 0x100) {
          (this->inverse_remapping).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = (uchar)lVar11;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
      (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[this->TERMINATOR] = '\0';
      iVar7 = (*this->bwIt->_vptr_BackwardIterator[2])();
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        iVar7 = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_78 != (uchar *)0x0) {
        operator_delete(local_78);
        iVar7 = extraout_EAX;
      }
      return iVar7;
    }
    uVar6 = (*this->bwIt->_vptr_BackwardIterator[3])();
    local_7a = SUB41(uVar6,0);
    if (local_7a == false) break;
    rVar14 = std::vector<bool,_std::allocator<bool>_>::at(&local_58,(ulong)(uVar6 & 0xff));
    if ((*rVar14._M_p & rVar14._M_mask) == 0) {
      rVar14 = std::vector<bool,_std::allocator<bool>_>::at(&local_58,(ulong)local_7a);
      *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
      if (iStack_70._M_current == local_68) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,iStack_70,
                   &local_7a);
      }
      else {
        *iStack_70._M_current = local_7a;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
    }
    iVar5 = (int)(uVar13 / this->n);
    if ((iVar7 < iVar5 & bVar12 & iVar5 * -0x33333333 + 0x19999999U < 0x33333333) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"% done.",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      iVar7 = iVar5;
    }
    uVar13 = uVar13 + 100;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR while reading input text : the text contains a 0x0 byte.\n");
  exit(0);
}

Assistant:

void init(BackwardIterator * bfr, bool verbose){

		if(verbose) cout << "\n*** Building context automata ***\n\n";

		bwIt = bfr;

		n = bwIt->length();
		null_ptr = ~((uint)0);

		if(verbose) cout << " Text length is " << n << endl;

		remapping = vector<uint>(256);
		inverse_remapping = vector<symbol>(256);

		for(uint i=0;i<256;i++){
			remapping[i]=empty;
			inverse_remapping[i]=0;
		}

		if(verbose) cout << "\n scanning file to detect alphabet ... " << endl;

		vector<symbol> alphabet = vector<symbol>();

		ulint symbols_read=0;
		vector<bool> inserted = vector<bool>(256,false);

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			symbol s = bwIt->read();

			if(s==0){

				cout << "ERROR while reading input text : the text contains a 0x0 byte.\n";
				exit(0);

			}

			if(not inserted.at(s)){
				inserted.at(s) = true;
				alphabet.push_back(s);
			}

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

			symbols_read++;

		}

		if(verbose) cout << " done.\n\n Sorting alphabet ... " << flush;

		std::sort(alphabet.begin(),alphabet.end());

		if(verbose) cout << "done. Alphabet size: sigma = " << alphabet.size() << endl;

		sigma = 1;//code 0x0 is for the terminator

		//if(verbose) cout << "\n Alphabet = { ";

		for (uint i=0;i<alphabet.size();i++){

			if(remapping[alphabet.at(i)]==empty){//new symbol

				remapping[alphabet.at(i)] = sigma;
				sigma++;

			}

			//if(verbose) cout << alphabet.at(i) << ' ';

		}

		//if(verbose) cout << "}\n\n";

		if(verbose) cout << "\n Alphabet (ASCII codes) = { ";

		for (uint i=0;i<alphabet.size();i++)
			if(verbose) cout << (ulint)alphabet.at(i) << ' ';

		if(verbose) cout << "}" << endl;

		TERMINATOR = 0;

		for(uint i=1;i<256;i++)
			if(remapping[i]!=empty)
				inverse_remapping[remapping[i]] = i;

		inverse_remapping[TERMINATOR] = 0;//0 is the terminator appended in the file

		bwIt->rewind();

	}